

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O0

tensor * Abs(tensor *a)

{
  initializer_list<tensor_*> __l;
  int iVar1;
  ABS *this;
  undefined4 extraout_var;
  allocator<tensor_*> local_59;
  node *local_58;
  node **local_50;
  size_type local_48;
  vector<tensor_*,_std::allocator<tensor_*>_> local_40;
  ABS *local_18;
  node *op;
  tensor *a_local;
  
  op = (node *)a;
  this = (ABS *)operator_new(0x48);
  (this->super_node).grad_fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_node).grad_fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_node).input.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_node).grad_fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_node).input.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_node).input.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_node)._vptr_node = (_func_int **)0x0;
  (this->super_node).ret = (tensor *)0x0;
  *(undefined8 *)&(this->super_node).isbuild = 0;
  ABS::ABS(this);
  local_58 = op;
  local_50 = &local_58;
  local_48 = 1;
  local_18 = this;
  std::allocator<tensor_*>::allocator(&local_59);
  __l._M_len = local_48;
  __l._M_array = (iterator)local_50;
  std::vector<tensor_*,_std::allocator<tensor_*>_>::vector(&local_40,__l,&local_59);
  iVar1 = (**(this->super_node)._vptr_node)(this,&local_40);
  std::vector<tensor_*,_std::allocator<tensor_*>_>::~vector(&local_40);
  std::allocator<tensor_*>::~allocator(&local_59);
  return (tensor *)CONCAT44(extraout_var,iVar1);
}

Assistant:

tensor* Abs(tensor *a){
    node *op = new ABS();
    return op->forward({a});
}